

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O2

void json_append_string(lua_State *l,strbuf_t *json,int lindex)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  char *pcVar3;
  ulong uVar4;
  size_t len;
  ulong local_28;
  
  local_28 = in_RAX;
  pcVar3 = lua_tolstring(l,lindex,&local_28);
  strbuf_ensure_empty_length(json,(int)local_28 * 6 + 2);
  iVar2 = json->length;
  json->length = iVar2 + 1;
  json->buf[iVar2] = '\"';
  for (uVar4 = 0; uVar4 < local_28; uVar4 = uVar4 + 1) {
    bVar1 = pcVar3[uVar4];
    if (char2escape[bVar1] == (char *)0x0) {
      iVar2 = json->length;
      json->length = iVar2 + 1;
      json->buf[iVar2] = bVar1;
    }
    else {
      strbuf_append_string(json,char2escape[bVar1]);
    }
  }
  iVar2 = json->length;
  json->length = iVar2 + 1;
  json->buf[iVar2] = '\"';
  return;
}

Assistant:

static void json_append_string(lua_State *l, strbuf_t *json, int lindex)
{
    const char *escstr;
    const char *str;
    size_t len;
    size_t i;

    str = lua_tolstring(l, lindex, &len);

    /* Worst case is len * 6 (all unicode escapes).
     * This buffer is reused constantly for small strings
     * If there are any excess pages, they won't be hit anyway.
     * This gains ~5% speedup. */
    strbuf_ensure_empty_length(json, len * 6 + 2);

    strbuf_append_char_unsafe(json, '\"');
    for (i = 0; i < len; i++) {
        escstr = char2escape[(unsigned char)str[i]];
        if (escstr)
            strbuf_append_string(json, escstr);
        else
            strbuf_append_char_unsafe(json, str[i]);
    }
    strbuf_append_char_unsafe(json, '\"');
}